

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::EndTabBar(void)

{
  ImGuiWindow *pIVar1;
  ImGuiTabBar *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  float fVar5;
  bool tab_bar_appearing;
  ImGuiTabBar *tab_bar;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabBar *in_stack_000001a0;
  ImGuiTabBar *local_28;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar6;
  
  pIVar3 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  if (((pIVar1->SkipItems & 1U) == 0) &&
     (pIVar2 = GImGui->CurrentTabBar, pIVar2 != (ImGuiTabBar *)0x0)) {
    if ((pIVar2->WantLayout & 1U) != 0) {
      TabBarLayout(in_stack_000001a0);
    }
    uVar6 = pIVar2->PrevFrameVisible + 1 < pIVar3->FrameCount;
    if ((((pIVar2->VisibleTabWasSubmitted & 1U) != 0) || (pIVar2->VisibleTabId == 0)) ||
       ((bool)uVar6)) {
      fVar5 = ImMax<float>((pIVar1->DC).CursorPos.y - (pIVar2->BarRect).Max.y,
                           pIVar2->CurrTabsContentsHeight);
      pIVar2->CurrTabsContentsHeight = fVar5;
      (pIVar1->DC).CursorPos.y = (pIVar2->BarRect).Max.y + pIVar2->CurrTabsContentsHeight;
    }
    else {
      (pIVar1->DC).CursorPos.y = (pIVar2->BarRect).Max.y + pIVar2->PrevTabsContentsHeight;
    }
    if ('\x01' < pIVar2->BeginCount) {
      (pIVar1->DC).CursorPos = pIVar2->BackupCursorPos;
    }
    if ((pIVar2->Flags & 0x100000U) == 0) {
      PopID();
    }
    ImVector<ImGuiPtrOrIndex>::pop_back(&pIVar3->CurrentTabBarStack);
    bVar4 = ImVector<ImGuiPtrOrIndex>::empty(&pIVar3->CurrentTabBarStack);
    if (bVar4) {
      local_28 = (ImGuiTabBar *)0x0;
    }
    else {
      ImVector<ImGuiPtrOrIndex>::back(&pIVar3->CurrentTabBarStack);
      local_28 = GetTabBarFromTabBarRef
                           ((ImGuiPtrOrIndex *)CONCAT17(uVar6,in_stack_ffffffffffffffe0));
    }
    pIVar3->CurrentTabBar = local_28;
  }
  return;
}

Assistant:

void    ImGui::EndTabBar()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return;

    ImGuiTabBar* tab_bar = g.CurrentTabBar;
    if (tab_bar == NULL)
    {
        IM_ASSERT_USER_ERROR(tab_bar != NULL, "Mismatched BeginTabBar()/EndTabBar()!");
        return;
    }

    // Fallback in case no TabItem have been submitted
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    // Restore the last visible height if no tab is visible, this reduce vertical flicker/movement when a tabs gets removed without calling SetTabItemClosed().
    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    if (tab_bar->VisibleTabWasSubmitted || tab_bar->VisibleTabId == 0 || tab_bar_appearing)
    {
        tab_bar->CurrTabsContentsHeight = ImMax(window->DC.CursorPos.y - tab_bar->BarRect.Max.y, tab_bar->CurrTabsContentsHeight);
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->CurrTabsContentsHeight;
    }
    else
    {
        window->DC.CursorPos.y = tab_bar->BarRect.Max.y + tab_bar->PrevTabsContentsHeight;
    }
    if (tab_bar->BeginCount > 1)
        window->DC.CursorPos = tab_bar->BackupCursorPos;

    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        PopID();

    g.CurrentTabBarStack.pop_back();
    g.CurrentTabBar = g.CurrentTabBarStack.empty() ? NULL : GetTabBarFromTabBarRef(g.CurrentTabBarStack.back());
}